

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void * vline_tilde_new(void)

{
  _inlet *p_Var1;
  t_object *owner;
  t_symbol *s;
  
  owner = (t_object *)pd_new(vline_tilde_class);
  s = gensym("signal");
  outlet_new(owner,s);
  floatinlet_new(owner,(t_float *)((long)&owner[2].te_binbuf + 4));
  floatinlet_new(owner,(t_float *)&owner[2].te_outlet);
  *(undefined8 *)((long)&owner[2].te_binbuf + 4) = 0;
  owner[1].te_g.g_pd = (t_pd)0x0;
  owner[1].te_g.g_next = (_gobj *)0x0;
  p_Var1 = (_inlet *)clock_getlogicaltime();
  owner[1].te_inlet = p_Var1;
  owner[1].te_outlet = (_outlet *)p_Var1;
  owner[1].te_binbuf = (_binbuf *)p_Var1;
  owner[2].te_inlet = (_inlet *)0x0;
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  owner[2].te_g.g_next = (_gobj *)0x4415af1d78b58c40;
  return owner;
}

Assistant:

static void *vline_tilde_new(void)
{
    t_vline *x = (t_vline *)pd_new(vline_tilde_class);
    outlet_new(&x->x_obj, gensym("signal"));
    floatinlet_new(&x->x_obj, &x->x_inlet1);
    floatinlet_new(&x->x_obj, &x->x_inlet2);
    x->x_inlet1 = x->x_inlet2 = 0;
    x->x_value = x->x_inc = 0;
    x->x_referencetime = x->x_lastlogicaltime = x->x_nextblocktime =
        clock_getlogicaltime();
    x->x_list = 0;
    x->x_samppermsec = 0;
    x->x_targettime = 1e20;
    return (x);
}